

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void * arena_bin_malloc_hard(tsdn_t *tsdn,arena_t *arena,bin_t *bin,szind_t binind,uint binshard)

{
  uint64_t *puVar1;
  size_t *psVar2;
  ulong size;
  extent_t *slab;
  arena_t *arena_00;
  void *pvVar3;
  uint *bin_00;
  undefined4 in_register_00000084;
  bin_info_t *bin_info;
  _Bool zero;
  _Bool commit;
  _Bool zero_1;
  extent_hooks_t *extent_hooks;
  _Bool local_54;
  _Bool local_53;
  _Bool local_52;
  _Bool local_51;
  tsdn_t *local_50;
  uint local_44;
  extent_hooks_t *local_40;
  long local_38;
  
  local_38 = CONCAT44(in_register_00000084,binshard);
  bin_00 = &manual_arena_base;
  if ((manual_arena_base <= arena->base->ind) && (bin->slabcur != (extent_t *)0x0)) {
    arena_bin_slabs_full_insert(arena,bin,bin->slabcur);
    bin->slabcur = (extent_t *)0x0;
  }
  bin_info = bin_infos + binind;
  arena_00 = (arena_t *)arena_bin_slabs_nonfull_tryget(bin);
  if (arena_00 != (arena_t *)0x0) goto LAB_0010fb15;
  (bin->lock).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40));
  local_40 = (extent_hooks_t *)0x0;
  size = bin_info->reg_size;
  local_50 = tsdn;
  if (size < 0x1001) {
    local_44 = (uint)sz_size2index_tab[size + 7 >> 3];
  }
  else {
    local_44 = sz_size2index_compute(size);
  }
  local_54 = false;
  local_53 = true;
  arena_00 = (arena_t *)
             extents_alloc(local_50,arena,&local_40,&arena->extents_dirty,(void *)0x0,
                           bin_infos[binind].slab_size,0,0x1000,true,binind,&local_54,&local_53);
  tsdn = local_50;
  if ((arena_00 == (arena_t *)0x0) &&
     (((arena->decay_muzzy).time_ms.repr == 0 ||
      (arena_00 = (arena_t *)
                  extents_alloc(local_50,arena,&local_40,&arena->extents_muzzy,(void *)0x0,
                                bin_infos[binind].slab_size,0,0x1000,true,binind,&local_54,&local_53
                               ), tsdn = local_50, arena_00 == (arena_t *)0x0)))) {
    tsdn = local_50;
    local_51 = false;
    local_52 = true;
    bin_00 = (uint *)0x0;
    arena_00 = (arena_t *)
               extent_alloc_wrapper
                         (local_50,arena,&local_40,(void *)0x0,bin_infos[binind].slab_size,0,0x1000,
                          true,local_44,&local_51,&local_52);
    if (arena_00 != (arena_t *)0x0) {
      LOCK();
      (arena->stats).mapped.repr = (arena->stats).mapped.repr + bin_infos[binind].slab_size;
      UNLOCK();
      goto LAB_0010f9cf;
    }
    arena_00 = (arena_t *)0x0;
  }
  else {
LAB_0010f9cf:
    bin_00 = (uint *)(*(ulong *)arena_00->nthreads & 0xfffffc0003ffffff);
    *(ulong *)arena_00->nthreads =
         (ulong)bin_infos[binind].nregs << 0x1a | local_38 << 0x24 | (ulong)bin_00;
    bitmap_init(&(arena_00->stats).decay_dirty.purged.repr,&bin_infos[binind].bitmap_info,false);
    LOCK();
    (arena->nactive).repr =
         (arena->nactive).repr +
         (((anon_union_8_2_694bb3b2_for_extent_s_2 *)&arena_00->last_thd)->e_size_esn >> 0xc);
    UNLOCK();
  }
  malloc_mutex_lock(tsdn,&bin->lock);
  if (arena_00 == (arena_t *)0x0) {
    arena_00 = (arena_t *)arena_bin_slabs_nonfull_tryget(bin);
  }
  else {
    puVar1 = &(bin->stats).nslabs;
    *puVar1 = *puVar1 + 1;
    psVar2 = &(bin->stats).curslabs;
    *psVar2 = *psVar2 + 1;
  }
LAB_0010fb15:
  slab = bin->slabcur;
  if (slab != (extent_t *)0x0) {
    if ((slab->e_bits & 0xffc000000) != 0) {
      pvVar3 = arena_slab_reg_alloc(slab,bin_info);
      if (arena_00 == (arena_t *)0x0) {
        return pvVar3;
      }
      if (((uint)(*(ulong *)arena_00->nthreads >> 0x1a) & 0x3ff) == bin_infos[binind].nregs) {
        arena_dalloc_bin_slab(tsdn,arena,(extent_t *)arena_00,bin);
        return pvVar3;
      }
      arena_bin_lower_slab((tsdn_t *)arena,arena_00,(extent_t *)bin,(bin_t *)bin_00);
      return pvVar3;
    }
    arena_bin_slabs_full_insert(arena,bin,slab);
    bin->slabcur = (extent_t *)0x0;
  }
  if (arena_00 == (arena_t *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    bin->slabcur = (extent_t *)arena_00;
    pvVar3 = arena_slab_reg_alloc((extent_t *)arena_00,bin_info);
  }
  return pvVar3;
}

Assistant:

static void *
arena_bin_malloc_hard(tsdn_t *tsdn, arena_t *arena, bin_t *bin,
    szind_t binind, unsigned binshard) {
	const bin_info_t *bin_info;
	extent_t *slab;

	bin_info = &bin_infos[binind];
	if (!arena_is_auto(arena) && bin->slabcur != NULL) {
		arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		bin->slabcur = NULL;
	}
	slab = arena_bin_nonfull_slab_get(tsdn, arena, bin, binind, binshard);
	if (bin->slabcur != NULL) {
		/*
		 * Another thread updated slabcur while this one ran without the
		 * bin lock in arena_bin_nonfull_slab_get().
		 */
		if (extent_nfree_get(bin->slabcur) > 0) {
			void *ret = arena_slab_reg_alloc(bin->slabcur,
			    bin_info);
			if (slab != NULL) {
				/*
				 * arena_slab_alloc() may have allocated slab,
				 * or it may have been pulled from
				 * slabs_nonfull.  Therefore it is unsafe to
				 * make any assumptions about how slab has
				 * previously been used, and
				 * arena_bin_lower_slab() must be called, as if
				 * a region were just deallocated from the slab.
				 */
				if (extent_nfree_get(slab) == bin_info->nregs) {
					arena_dalloc_bin_slab(tsdn, arena, slab,
					    bin);
				} else {
					arena_bin_lower_slab(tsdn, arena, slab,
					    bin);
				}
			}
			return ret;
		}

		arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		bin->slabcur = NULL;
	}

	if (slab == NULL) {
		return NULL;
	}
	bin->slabcur = slab;

	assert(extent_nfree_get(bin->slabcur) > 0);

	return arena_slab_reg_alloc(slab, bin_info);
}